

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict try_attr_spec(c2m_ctx_t c2m_ctx,pos_t pos,node_t_conflict *asm_part)

{
  node_t_conflict pnVar1;
  node_t_conflict pnVar2;
  
  if (c2m_ctx->options->pedantic_p == 0) {
    if (asm_part != (node_t_conflict *)0x0) {
      *asm_part = (node_t_conflict)0x0;
      pnVar1 = try_f(c2m_ctx,asm_spec);
      if (pnVar1 != &err_struct) {
        if (c2m_ctx->options->pedantic_p != 0) {
          error(c2m_ctx,0x18e9a4,pos.fname,pos._8_8_);
        }
        *asm_part = pnVar1;
      }
    }
    pnVar2 = try_f(c2m_ctx,attr_spec);
    pnVar1 = &err_struct;
    if ((pnVar2 != &err_struct) && (pnVar1 = pnVar2, c2m_ctx->options->pedantic_p != 0)) {
      error(c2m_ctx,0x18e9bb,pos.fname,pos._8_8_);
    }
  }
  else {
    pnVar1 = (node_t_conflict)0x0;
  }
  return pnVar1;
}

Assistant:

static node_t try_attr_spec (c2m_ctx_t c2m_ctx, pos_t pos, node_t *asm_part) {
  node_t r;

  if (c2m_options->pedantic_p) return NULL;
  if (asm_part != NULL) {
    *asm_part = NULL;
    if ((r = TRY (asm_spec)) != err_node) {
      if (c2m_options->pedantic_p)
        error (c2m_ctx, pos, "asm is not implemented");
      else {
        /*warning (c2m_ctx, pos, "asm is not implemented -- ignoring it")*/
      }
      *asm_part = r;
    }
  }
  if ((r = TRY (attr_spec)) != err_node) {
    if (c2m_options->pedantic_p)
      error (c2m_ctx, pos, "GCC attributes are not implemented");
    else {
      /*warning (c2m_ctx, pos, "GCC attributes are not implemented -- ignoring them")*/
    }
  }
  return r;
}